

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::are_not_equal<float,float>(float *expected,float *actual,LocationInfo *location)

{
  FailedAssertion *this;
  allocator local_39;
  string local_38;
  
  if ((*expected == *actual) && (!NAN(*expected) && !NAN(*actual))) {
    this = (FailedAssertion *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string((string *)&local_38,"Values are equal!",&local_39);
    FailedAssertion::FailedAssertion(this,&local_38,location);
    __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  return;
}

Assistant:

inline void are_not_equal(const T1 &expected, const T2 &actual, const LocationInfo &location)
	{
		if (!(expected != actual))
			throw FailedAssertion("Values are equal!", location);
	}